

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O3

int Cortex_FreeBodyDefs(sBodyDefs *pBodyDefs)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  
  iVar1 = pBodyDefs->nBodyDefs;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      pvVar2 = *(void **)((long)&pBodyDefs->BodyDefs[0].szMarkerNames + lVar3);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
      }
      pvVar2 = *(void **)((long)&pBodyDefs->BodyDefs[0].Hierarchy.szSegmentNames + lVar3);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
      }
      pvVar2 = *(void **)((long)&pBodyDefs->BodyDefs[0].Hierarchy.iParents + lVar3);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
      }
      pvVar2 = *(void **)((long)&pBodyDefs->BodyDefs[0].szDofNames + lVar3);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
      }
      lVar3 = lVar3 + 0x40;
    } while ((long)iVar1 * 0x40 != lVar3);
  }
  if (pBodyDefs->szAnalogChannelNames != (char **)0x0) {
    free(pBodyDefs->szAnalogChannelNames);
  }
  if (pBodyDefs->AllocatedSpace != (void *)0x0) {
    free(pBodyDefs->AllocatedSpace);
  }
  free(pBodyDefs);
  return 0;
}

Assistant:

int Cortex_FreeBodyDefs(sBodyDefs* pBodyDefs)
{
  int nBodies = pBodyDefs->nBodyDefs;
  int iBody;

  for (iBody = 0; iBody < nBodies; iBody++) {
    sBodyDef *pBody = &pBodyDefs->BodyDefs[iBody];

    // Free each array of pointers to the names
    if (pBody->szMarkerNames != NULL)
      free(pBody->szMarkerNames);
    if (pBody->Hierarchy.szSegmentNames != NULL)
      free(pBody->Hierarchy.szSegmentNames);
    if (pBody->Hierarchy.iParents != NULL)
      free(pBody->Hierarchy.iParents);
    if (pBody->szDofNames != NULL)
      free(pBody->szDofNames);
  }

  if (pBodyDefs->szAnalogChannelNames != NULL)
    free(pBodyDefs->szAnalogChannelNames);

  // Free the big space that contains all the names
  if (pBodyDefs->AllocatedSpace != NULL)
    free(pBodyDefs->AllocatedSpace);
  memset(pBodyDefs, 0, sizeof(sBodyDef)); // not needed anymore
  free(pBodyDefs);

  return RC_Okay;
}